

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O0

void __thiscall
HighsSimplexAnalysis::operationRecordBefore
          (HighsSimplexAnalysis *this,HighsInt operation_type,HighsInt current_count,
          double historical_density)

{
  int iVar1;
  AnIterOpRec *pAVar2;
  AnIterOpRec *AnIter;
  double current_density;
  double historical_density_local;
  HighsInt current_count_local;
  HighsInt operation_type_local;
  HighsSimplexAnalysis *this_local;
  
  iVar1 = this->numRow;
  pAVar2 = this->AnIterOp + operation_type;
  pAVar2->AnIterOpNumCa = pAVar2->AnIterOpNumCa + 1;
  if ((((double)current_count * 1.0) / (double)iVar1 <= pAVar2->AnIterOpHyperCANCEL) &&
     (historical_density <= pAVar2->AnIterOpHyperTRAN)) {
    pAVar2->AnIterOpNumHyperOp = pAVar2->AnIterOpNumHyperOp + 1;
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::operationRecordBefore(
    const HighsInt operation_type, const HighsInt current_count,
    const double historical_density) {
  double current_density = 1.0 * current_count / numRow;
  AnIterOpRec& AnIter = AnIterOp[operation_type];
  AnIter.AnIterOpNumCa++;
  if (current_density <= AnIter.AnIterOpHyperCANCEL &&
      historical_density <= AnIter.AnIterOpHyperTRAN)
    AnIter.AnIterOpNumHyperOp++;
}